

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_datalink_name_to_val(char *name)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  dlt_choice *pdVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar5 = "DLT_NULL";
  lVar3 = 0;
  pdVar4 = dlt_choices;
  do {
    lVar6 = 0;
    do {
      lVar2 = lVar6 + 4;
      pbVar1 = (byte *)(name + lVar6);
      if (""[(byte)pcVar5[lVar2]] != ""[*pbVar1]) goto LAB_00116470;
      lVar6 = lVar6 + 1;
    } while (pcVar5[lVar2] != 0);
    if (""[(byte)pcVar5[lVar2]] == ""[*pbVar1]) {
      return pdVar4->dlt;
    }
LAB_00116470:
    lVar3 = lVar3 + 1;
    pdVar4 = dlt_choices + lVar3;
    pcVar5 = pdVar4->name;
    if (pcVar5 == (char *)0x0) {
      return -1;
    }
  } while( true );
}

Assistant:

int
pcap_datalink_name_to_val(const char *name)
{
	int i;

	for (i = 0; dlt_choices[i].name != NULL; i++) {
		if (pcap_strcasecmp(dlt_choices[i].name + sizeof("DLT_") - 1,
		    name) == 0)
			return (dlt_choices[i].dlt);
	}
	return (-1);
}